

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O2

uint32_t __thiscall cfd::core::Transaction::GetVsize(Transaction *this)

{
  void *pvVar1;
  uint32_t uVar2;
  
  pvVar1 = (this->super_AbstractTransaction).wally_tx_pointer_;
  if ((*(long *)((long)pvVar1 + 0x10) == 0) && (*(long *)((long)pvVar1 + 0x28) == 0)) {
    return 10;
  }
  uVar2 = AbstractTransaction::GetVsize(&this->super_AbstractTransaction);
  return uVar2;
}

Assistant:

uint32_t Transaction::GetVsize() const {
  size_t vsize = 0;
  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  // If both input / output are 0, libwally misidentifies as ElementsTransaction
  if ((tx_pointer->num_inputs == 0) && (tx_pointer->num_outputs == 0)) {
    vsize = static_cast<size_t>(kTransactionMinimumSize);
  } else {
    vsize = AbstractTransaction::GetVsize();
  }
  return static_cast<uint32_t>(vsize);
}